

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fSyncTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles3::Functional::FenceSyncCase::iterate(FenceSyncCase *this)

{
  size_type *psVar1;
  CallLogWrapper *this_00;
  Random *rnd;
  ostringstream *poVar2;
  TestLog *log;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  GLenum GVar6;
  uint uVar7;
  GLenum err;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  GLsync p_Var11;
  TestError *this_01;
  int iVar12;
  long *plVar13;
  TestLog *pTVar14;
  IterateResult IVar15;
  long lVar16;
  char *pcVar17;
  TestLog TVar18;
  qpTestLog *pqVar19;
  float fVar20;
  vector<float,_std::allocator<float>_> vertices;
  ScopedLogSection section;
  string header;
  vector<float,_std::allocator<float>_> local_268;
  ScopedLogSection local_250;
  long local_248;
  TestLog local_240;
  long lStack_238;
  string local_230;
  qpTestLog **local_210;
  long local_208;
  qpTestLog *local_200 [2];
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar8 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar8 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0xaeb91d);
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_1e0 = *plVar13;
    lStack_1d8 = plVar9[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar13;
    local_1f0 = (long *)*plVar9;
  }
  local_1e8 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  pTVar14 = (TestLog *)(plVar9 + 2);
  if ((TestLog *)*plVar9 == pTVar14) {
    local_240.m_log = pTVar14->m_log;
    lStack_238 = plVar9[3];
    local_250.m_log = &local_240;
  }
  else {
    local_240.m_log = pTVar14->m_log;
    local_250.m_log = (TestLog *)*plVar9;
  }
  local_248 = plVar9[1];
  *plVar9 = (long)pTVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  TVar18.m_log = (qpTestLog *)0xf;
  if (local_250.m_log != &local_240) {
    TVar18.m_log = local_240.m_log;
  }
  if (TVar18.m_log < (qpTestLog *)(local_208 + local_248)) {
    pqVar19 = (qpTestLog *)0xf;
    if (local_210 != local_200) {
      pqVar19 = local_200[0];
    }
    if (pqVar19 < (qpTestLog *)(local_208 + local_248)) goto LAB_005057d4;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_250.m_log);
  }
  else {
LAB_005057d4:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_210);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_230.field_2._M_allocated_capacity = *psVar1;
    local_230.field_2._8_8_ = puVar10[3];
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar1;
    local_230._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_230._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_210 != local_200) {
    operator_delete(local_210,(ulong)((long)&local_200[0]->flags + 1));
  }
  if (local_250.m_log != &local_240) {
    operator_delete(local_250.m_log,(ulong)((long)&(local_240.m_log)->flags + 1));
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection(&local_250,log,&local_230,&local_230);
  this_00 = &this->super_CallLogWrapper;
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glUseProgram(this_00,(this->m_program->m_program).m_program);
  glu::CallLogWrapper::glEnable(this_00,0xb71);
  glu::CallLogWrapper::glClearColor(this_00,0.3,0.3,0.3,1.0);
  glu::CallLogWrapper::glClearDepthf(this_00,1.0);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  iVar8 = *(int *)&(this->super_CallLogWrapper).field_0x14;
  std::vector<float,_std::allocator<float>_>::resize(&local_268,(long)(iVar8 * 0xc));
  uVar7 = iVar8 * 3;
  if (0 < (int)uVar7) {
    rnd = &this->m_rnd;
    lVar16 = 0;
    do {
      fVar20 = deRandom_getFloat(&rnd->m_rnd);
      iVar8 = (int)lVar16;
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar8] = fVar20 + fVar20 + -1.0;
      fVar20 = deRandom_getFloat(&rnd->m_rnd);
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar8 + 1] = fVar20 + fVar20 + -1.0;
      fVar20 = deRandom_getFloat(&rnd->m_rnd);
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar8 + 2] = fVar20 + 0.0;
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar8 + 3] = 1.0;
      lVar16 = lVar16 + 4;
    } while ((ulong)uVar7 << 2 != lVar16);
  }
  glu::CallLogWrapper::glVertexAttribPointer
            (this_00,0,4,0x1406,'\0',0,
             local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar8 = (int)((ulong)((long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  iVar12 = iVar8 + 3;
  if (-1 < iVar8) {
    iVar12 = iVar8;
  }
  glu::CallLogWrapper::glDrawArrays(this_00,4,0,iVar12 >> 2);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// Primitives drawn.",0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  p_Var11 = glu::CallLogWrapper::glFenceSync(this_00,0x9117,0);
  this->m_syncObject = p_Var11;
  GVar6 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar6,"Sync object created",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                  ,0xcb);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// Sync object created.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  uVar7 = this->m_caseOptions;
  if ((uVar7 & 1) != 0) {
    glu::CallLogWrapper::glFlush(this_00);
    uVar7 = this->m_caseOptions;
  }
  if ((uVar7 & 2) != 0) {
    glu::CallLogWrapper::glFinish(this_00);
  }
  uVar7 = this->m_waitCommand;
  if ((uVar7 & 1) != 0) {
    glu::CallLogWrapper::glWaitSync(this_00,this->m_syncObject,this->m_waitFlags,this->m_timeout);
    GVar6 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar6,"glWaitSync called",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                    ,0xdc);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Wait command glWaitSync called with GL_TIMEOUT_IGNORED.",0x3a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    uVar7 = this->m_waitCommand;
  }
  bVar3 = 1;
  bVar5 = 1;
  if ((uVar7 & 2) != 0) {
    GVar6 = glu::CallLogWrapper::glClientWaitSync
                      (this_00,this->m_syncObject,this->m_waitFlags,this->m_timeout);
    err = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(err,"glClientWaitSync called",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                    ,0xe2);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// glClientWaitSync return value:",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    switch(GVar6) {
    case 0x911a:
      poVar2 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"// GL_ALREADY_SIGNALED",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      bVar5 = 0;
      goto LAB_00505e05;
    case 0x911b:
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"// GL_TIMEOUT_EXPIRED",0x15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case 0x911c:
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"// GL_CONDITION_SATISFIED",0x19);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case 0x911d:
      poVar2 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// GL_WAIT_FAILED",0x11)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      bVar4 = false;
      goto LAB_00505e08;
    default:
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"// Illegal return value!",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                 ,0xea);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
  }
LAB_00505e05:
  bVar3 = bVar5;
  bVar4 = true;
LAB_00505e08:
  glu::CallLogWrapper::glFinish(this_00);
  if (!(bool)(bVar3 ^ 1 | (this->m_caseOptions & 2) == 0)) {
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Expected glClientWaitSync to return GL_ALREADY_SIGNALED.",0x3b)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    bVar4 = false;
  }
  if (this->m_syncObject != (GLsync)0x0) {
    glu::CallLogWrapper::glDeleteSync(this_00,this->m_syncObject);
    this->m_syncObject = (GLsync)0x0;
    GVar6 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar6,"Sync object deleted",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                    ,0xfc);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Sync object deleted.",0x17);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
  }
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// Test result: ",0x10);
  pcVar17 = "Failed!";
  if (bVar4) {
    pcVar17 = "Passed!";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,pcVar17,7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (bVar4) {
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Sync objects created and deleted successfully.",0x31);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    iVar8 = this->m_iterNdx + 1;
    this->m_iterNdx = iVar8;
    IVar15 = (IterateResult)(iVar8 < 5);
  }
  else {
    IVar15 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  tcu::TestLog::endSection(local_250.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return IVar15;
}

Assistant:

FenceSyncCase::IterateResult FenceSyncCase::iterate (void)
{
	TestLog&					log			= m_testCtx.getLog();
	std::vector<float>			vertices;
	bool						testOk		= true;

	std::string					header		= "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	const tcu::ScopedLogSection	section		(log, header, header);

	enableLogging(true);

	DE_ASSERT		(m_program);
	glUseProgram	(m_program->getProgram());
	glEnable		(GL_DEPTH_TEST);
	glClearColor	(0.3f, 0.3f, 0.3f, 1.0f);
	glClearDepthf	(1.0f);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray (0);
	generateVertices		  (vertices, m_numPrimitives, m_rnd);
	glVertexAttribPointer	  (0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);

	// Draw

	glDrawArrays(GL_TRIANGLES, 0, (int)vertices.size() / 4);
	log << TestLog::Message << "// Primitives drawn." << TestLog::EndMessage;

	// Create sync object

	m_syncObject = glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLU_CHECK_MSG ("Sync object created");
	log << TestLog::Message << "// Sync object created." << TestLog::EndMessage;

	if (m_caseOptions & CASE_FLUSH_BEFORE_WAIT)
		glFlush();
	if (m_caseOptions & CASE_FINISH_BEFORE_WAIT)
		glFinish();

	// Wait for sync object

	GLenum waitValue = 0;

	if (m_waitCommand & COMMAND_WAIT_SYNC)
	{
		DE_ASSERT(m_timeout == GL_TIMEOUT_IGNORED);
		DE_ASSERT(m_waitFlags == 0);
		glWaitSync(m_syncObject, m_waitFlags, m_timeout);
		GLU_CHECK_MSG ("glWaitSync called");
		log << TestLog::Message << "// Wait command glWaitSync called with GL_TIMEOUT_IGNORED." << TestLog::EndMessage;
	}
	if (m_waitCommand & COMMAND_CLIENT_WAIT_SYNC)
	{
		waitValue = glClientWaitSync(m_syncObject, m_waitFlags, m_timeout);
		GLU_CHECK_MSG ("glClientWaitSync called");
		log << TestLog::Message << "// glClientWaitSync return value:" << TestLog::EndMessage;
		switch (waitValue)
		{
			case GL_ALREADY_SIGNALED:	 log << TestLog::Message << "// GL_ALREADY_SIGNALED"	<< TestLog::EndMessage; break;
			case GL_TIMEOUT_EXPIRED:	 log << TestLog::Message << "// GL_TIMEOUT_EXPIRED"		<< TestLog::EndMessage; break;
			case GL_CONDITION_SATISFIED: log << TestLog::Message << "// GL_CONDITION_SATISFIED"	<< TestLog::EndMessage; break;
			case GL_WAIT_FAILED:		 log << TestLog::Message << "// GL_WAIT_FAILED"			<< TestLog::EndMessage; testOk = false; break;
			default:					 TCU_FAIL("// Illegal return value!");
		}
	}

	glFinish();

	if (m_caseOptions & CASE_FINISH_BEFORE_WAIT && waitValue != GL_ALREADY_SIGNALED)
	{
		testOk = false;
		log << TestLog::Message << "// Expected glClientWaitSync to return GL_ALREADY_SIGNALED." << TestLog::EndMessage;
	}

	// Delete sync object

	if (m_syncObject)
	{
		glDeleteSync(m_syncObject);
		m_syncObject = DE_NULL;
		GLU_CHECK_MSG ("Sync object deleted");
		log << TestLog::Message << "// Sync object deleted." << TestLog::EndMessage;
	}

	// Evaluate test result

	log << TestLog::Message << "// Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "// Sync objects created and deleted successfully." << TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}